

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

int nni_copyin_int(int *ip,void *v,size_t sz,int minv,int maxv,nni_type t)

{
  int iVar1;
  int i;
  nni_type t_local;
  int maxv_local;
  int minv_local;
  size_t sz_local;
  void *v_local;
  int *ip_local;
  
  if (t == NNI_TYPE_INT32) {
    iVar1 = *v;
    if (maxv < iVar1) {
      ip_local._4_4_ = 3;
    }
    else if (iVar1 < minv) {
      ip_local._4_4_ = 3;
    }
    else {
      *ip = iVar1;
      ip_local._4_4_ = 0;
    }
  }
  else {
    ip_local._4_4_ = 0x1e;
  }
  return ip_local._4_4_;
}

Assistant:

int
nni_copyin_int(
    int *ip, const void *v, size_t sz, int minv, int maxv, nni_type t)
{
	int i;
	NNI_ARG_UNUSED(sz);

	if (t != NNI_TYPE_INT32) {
		return (NNG_EBADTYPE);
	}
	i = *(int *) v;
	if (i > maxv) {
		return (NNG_EINVAL);
	}
	if (i < minv) {
		return (NNG_EINVAL);
	}
	*ip = i;
	return (0);
}